

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O0

void evutil_usleep_(timeval *tv)

{
  undefined1 local_20 [8];
  timespec ts;
  timeval *tv_local;
  
  if (tv != (timeval *)0x0) {
    local_20 = (undefined1  [8])tv->tv_sec;
    ts.tv_sec = tv->tv_usec * 1000;
    ts.tv_nsec = (__syscall_slong_t)tv;
    nanosleep((timespec *)local_20,(timespec *)0x0);
  }
  return;
}

Assistant:

void
evutil_usleep_(const struct timeval *tv)
{
	if (!tv)
		return;
#if defined(_WIN32)
	{
		long msec = evutil_tv_to_msec_(tv);
		Sleep((DWORD)msec);
	}
#elif defined(EVENT__HAVE_NANOSLEEP)
	{
		struct timespec ts;
		ts.tv_sec = tv->tv_sec;
		ts.tv_nsec = tv->tv_usec*1000;
		nanosleep(&ts, NULL);
	}
#elif defined(EVENT__HAVE_USLEEP)
	/* Some systems don't like to usleep more than 999999 usec */
	sleep(tv->tv_sec);
	usleep(tv->tv_usec);
#else
	{
		struct timeval tv2 = *tv;
		select(0, NULL, NULL, NULL, &tv2);
	}
#endif
}